

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

char * loadFile(string *file)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  streamoff sVar4;
  ulong uVar5;
  double __x;
  undefined1 auVar6 [16];
  fpos<__mbstate_t> local_2e0;
  string *local_2d0;
  char *buffer;
  undefined8 local_2c0;
  int local_2b4;
  fpos afStack_2b0 [4];
  int size;
  undefined8 local_2a8;
  int local_29c;
  char local_298 [4];
  int begin;
  ifstream fin;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *file_local;
  
  local_18 = file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,".",&local_39);
  bVar1 = fileExists(file,false,(string *)local_38,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    _Var2 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_298,pcVar3,_Var2);
    _afStack_2b0 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long(afStack_2b0);
    local_29c = (int)sVar4;
    std::istream::seekg((long)local_298,_S_beg);
    auVar6 = std::istream::tellg();
    local_2c0 = auVar6._8_8_;
    buffer = auVar6._0_8_;
    sVar4 = std::fpos::operator_cast_to_long((fpos *)&buffer);
    local_2b4 = (int)sVar4 - local_29c;
    uVar5 = (ulong)local_2b4;
    if ((long)uVar5 < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_2d0 = (string *)operator_new__(uVar5);
    std::fpos<__mbstate_t>::fpos(&local_2e0,0);
    std::istream::seekg(local_298,local_2e0._M_off,local_2e0._M_state);
    std::istream::read(local_298,(long)local_2d0);
    std::ifstream::close();
    file_local = local_2d0;
    std::ifstream::~ifstream(local_298);
  }
  else {
    std::operator+((char *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "file does not exist ");
    __x = (double)std::operator+(local_70,(char *)local_90);
    log(__x);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
    file_local = (string *)0x0;
  }
  return (char *)file_local;
}

Assistant:

char * loadFile( string file )
{
	if (!fileExists(file))
	{
		log("file does not exist " + file + "\n");
		return NULL;
	}
	ifstream fin(file.c_str(), ifstream::in|ios::binary);
	int begin = fin.tellg();
	fin.seekg (0, ios::end);
	int size = (int)fin.tellg() - begin;
	char * buffer = new char[size];
	fin.seekg(0);
	fin.read(buffer, size);
	fin.close();
	//println("read " + str(size));
	return buffer;
}